

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_MuxTryOnce(Gia_Man_t *pNew,Str_Ntk_t *pNtk,Str_Mux_t *pTree,Str_Mux_t *pRoot,int Edge,
                  Vec_Int_t *vDelay,int fVerbose)

{
  Str_Mux_t *pTree_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint i;
  uint k;
  uint uVar4;
  int nLength;
  Str_Mux_t pBackup [3];
  int pPath [10000];
  Vec_Int_t *pVVar5;
  uint local_9d78;
  uint local_9d74;
  Str_Mux_t *local_9d70;
  uint local_9d68;
  uint local_9d64;
  uint local_9d60;
  int local_9d5c;
  uint local_9d58;
  uint local_9d54;
  Str_Mux_t *local_9d50;
  Vec_Int_t *local_9d48;
  Gia_Man_t *local_9d40;
  Str_Mux_t local_9d38 [3];
  int local_9c78 [10002];
  
  local_9d50 = pTree;
  uVar1 = Str_MuxDelayEdge_rec(pRoot,Edge);
  local_9d74 = 0;
  local_9d70 = pRoot;
  local_9d5c = Edge;
  iVar2 = Str_MuxFindPathEdge_rec(pRoot,Edge,local_9c78,(int *)&local_9d74);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    if (fVerbose != 0) {
      printf("Trying node %d with path of length %d.\n",(ulong)(uint)local_9d70->Id,
             (ulong)local_9d74);
    }
    local_9d68 = uVar1;
    local_9d48 = vDelay;
    local_9d40 = pNew;
    if ((int)local_9d74 < 1) {
      uVar4 = 0;
      local_9d78 = 0xffffffff;
    }
    else {
      local_9d78 = 0xffffffff;
      uVar4 = 0;
      i = 0;
      local_9d60 = local_9d74;
      uVar3 = local_9d74;
      do {
        k = i + 2;
        if ((int)k < (int)uVar3) {
          local_9d64 = i << 0x10;
          do {
            pTree_00 = local_9d50;
            local_9d58 = uVar1;
            local_9d54 = uVar4;
            Str_MuxChangeOnce(local_9d50,local_9c78,i,k,local_9d38,(Gia_Man_t *)0x0,(Vec_Int_t *)0x0
                             );
            uVar3 = Str_MuxDelayEdge_rec(local_9d70,local_9d5c);
            uVar1 = local_9d58;
            Str_MuxChangeUndo(pTree_00,local_9c78,i,k,local_9d38);
            uVar4 = local_9d54;
            if (((int)uVar3 < (int)uVar1) || ((0 < (int)local_9d78 && (uVar1 == uVar3)))) {
              local_9d78 = k | local_9d64;
              uVar1 = uVar3;
            }
            if (fVerbose != 0) {
              printf("%2d %2d -> %3d (%3d)\n",(ulong)i,(ulong)k,(ulong)uVar3);
            }
            uVar4 = uVar4 + 1;
            k = k + 1;
            uVar3 = local_9d60;
          } while (local_9d60 != k);
        }
        i = i + 1;
      } while (i != uVar3);
    }
    if (local_9d78 == 0xffffffff) {
      iVar2 = 0;
      if (fVerbose != 0) {
        puts("Did not find!");
        iVar2 = 0;
      }
    }
    else {
      pVVar5 = local_9d48;
      Str_MuxChangeOnce(local_9d50,local_9c78,(int)local_9d78 >> 0x10,local_9d78 & 0xffff,
                        (Str_Mux_t *)0x0,local_9d40,local_9d48);
      iVar2 = 1;
      if (fVerbose != 0) {
        printf("Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n",(ulong)(uint)local_9d70->Id,
               (ulong)(uint)((int)local_9d78 >> 0x10),(ulong)(local_9d78 & 0xffff),(ulong)uVar4,
               (ulong)local_9d68,CONCAT44((int)((ulong)pVVar5 >> 0x20),uVar1));
        putchar(10);
      }
    }
  }
  return iVar2;
}

Assistant:

int Str_MuxTryOnce( Gia_Man_t * pNew, Str_Ntk_t * pNtk, Str_Mux_t * pTree, Str_Mux_t * pRoot, int Edge, Vec_Int_t * vDelay, int fVerbose )
{
    int pPath[MAX_TREE];
    Str_Mux_t pBackup[3];
    int Delay, DelayBest = Str_MuxDelayEdge_rec( pRoot, Edge ), DelayInit = DelayBest;
    int i, k, nLength = 0, ForkBest = -1, nChecks = 0;
    int RetValue = Str_MuxFindPathEdge_rec( pRoot, Edge, pPath, &nLength );
    if ( RetValue == 0 )
        return 0;
    if ( fVerbose )
        printf( "Trying node %d with path of length %d.\n", pRoot->Id, nLength );
    for ( i = 0; i < nLength; i++ )
    for ( k = i+2; k < nLength; k++ )
    {
        Str_MuxChangeOnce( pTree, pPath, i, k, pBackup, NULL, NULL );
        Delay = Str_MuxDelayEdge_rec( pRoot, Edge );
        Str_MuxChangeUndo( pTree, pPath, i, k, pBackup );
        if ( DelayBest > Delay || (ForkBest > 0 && DelayBest == Delay) )
            DelayBest = Delay, ForkBest = (i << 16) | k;
        if ( fVerbose )
            printf( "%2d %2d -> %3d (%3d)\n", i, k, Delay, DelayBest );
        nChecks++;
    }
    if ( ForkBest == -1 )
    {
        if ( fVerbose )
            printf( "Did not find!\n" );
        return 0;
    }
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    Str_MuxChangeOnce( pTree, pPath, ForkBest >> 16, ForkBest & 0xFFFF, NULL, pNew, vDelay );
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    if ( fVerbose )
        printf( "Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n", 
            pRoot->Id, ForkBest >> 16, ForkBest & 0xFFFF, nChecks, DelayInit, DelayBest );
    if ( fVerbose )
        printf( "\n" );
    return 1;
}